

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O0

undefined8 __thiscall cnn::Cluster::toString_abi_cxx11_(Cluster *this)

{
  size_type sVar1;
  const_reference pvVar2;
  long in_RSI;
  undefined8 in_RDI;
  uint i;
  stringstream ss;
  uint local_19c;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  local_19c = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RSI + 0x18));
    if (sVar1 <= local_19c) break;
    if (local_19c != 0) {
      std::operator<<(local_188," ");
    }
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RSI + 0x18),
                        (ulong)local_19c);
    std::ostream::operator<<(local_188,*pvVar2);
    local_19c = local_19c + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string Cluster::toString() const {
  stringstream ss;
  for (unsigned i = 0; i < path.size(); ++i) {
    if (i != 0) {
      ss << " ";
    }
    ss << path[i];
  }
  return ss.str();
}